

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O3

void __thiscall absl::Cord::InlineRep::AssignSlow(InlineRep *this,InlineRep *src)

{
  CordRep *pCVar1;
  CordRep *pCVar2;
  bool bVar3;
  CordzInfo *this_00;
  
  if (src == this) {
    __assert_fail("&src != this",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O3/_deps/abseil-cpp-src/absl/strings/cord.cc"
                  ,300,"void absl::Cord::InlineRep::AssignSlow(const Cord::InlineRep &)");
  }
  if (((this->data_).rep_.field_0.data[0] & 1U) != 0) {
    pCVar1 = (this->data_).rep_.field_0.as_tree.rep;
    pCVar2 = (src->data_).rep_.field_0.as_tree.rep;
    if (pCVar2 == (CordRep *)0x0 || ((src->data_).rep_.field_0.data[0] & 1U) == 0) {
      this_00 = cord_internal::InlineData::cordz_info(&this->data_);
      if (this_00 != (CordzInfo *)0x0) {
        cord_internal::CordzInfo::Untrack(this_00);
      }
      pCVar2 = (src->data_).rep_.field_0.as_tree.rep;
      (this->data_).rep_.field_0.as_tree.cordz_info = (src->data_).rep_.field_0.as_tree.cordz_info;
      (this->data_).rep_.field_0.as_tree.rep = pCVar2;
    }
    else {
      LOCK();
      (pCVar2->refcount).count_.super___atomic_base<int>._M_i =
           (pCVar2->refcount).count_.super___atomic_base<int>._M_i + 2;
      UNLOCK();
      if (((this->data_).rep_.field_0.data[0] & 1U) == 0) {
        __assert_fail("is_tree()",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O3/_deps/abseil-cpp-src/absl/strings/internal/cord_internal.h"
                      ,0x29b,"void absl::cord_internal::InlineData::set_tree(CordRep *)");
      }
      (this->data_).rep_.field_0.as_tree.rep = pCVar2;
      bVar3 = cord_internal::InlineData::is_either_profiled(&this->data_,&src->data_);
      if (bVar3) {
        cord_internal::CordzInfo::MaybeTrackCordImpl(&this->data_,&src->data_,kAssignCord);
      }
    }
    cord_internal::CordRep::Unref(pCVar1);
    return;
  }
  if (((src->data_).rep_.field_0.data[0] & 1U) == 0) {
    __assert_fail("is_tree() || src.is_tree()",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O3/_deps/abseil-cpp-src/absl/strings/cord.cc"
                  ,0x12d,"void absl::Cord::InlineRep::AssignSlow(const Cord::InlineRep &)");
  }
  pCVar1 = (src->data_).rep_.field_0.as_tree.rep;
  if (pCVar1 != (CordRep *)0x0) {
    LOCK();
    (pCVar1->refcount).count_.super___atomic_base<int>._M_i =
         (pCVar1->refcount).count_.super___atomic_base<int>._M_i + 2;
    UNLOCK();
    (this->data_).rep_.field_0.as_tree.rep = pCVar1;
    (this->data_).rep_.field_0.as_tree.cordz_info = 1;
    bVar3 = cord_internal::InlineData::is_either_profiled(&this->data_,&src->data_);
    if (!bVar3) {
      return;
    }
    cord_internal::CordzInfo::MaybeTrackCordImpl(&this->data_,&src->data_,kAssignCord);
    return;
  }
  __assert_fail("rep != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O3/_deps/abseil-cpp-src/absl/strings/internal/cord_internal.h"
                ,0x38f,"static CordRep *absl::cord_internal::CordRep::Ref(CordRep *)");
}

Assistant:

void Cord::InlineRep::AssignSlow(const Cord::InlineRep& src) {
  assert(&src != this);
  assert(is_tree() || src.is_tree());
  auto constexpr method = CordzUpdateTracker::kAssignCord;
  if (ABSL_PREDICT_TRUE(!is_tree())) {
    EmplaceTree(CordRep::Ref(src.as_tree()), src.data_, method);
    return;
  }

  CordRep* tree = as_tree();
  if (CordRep* src_tree = src.tree()) {
    // Leave any existing `cordz_info` in place, and let MaybeTrackCord()
    // decide if this cord should be (or remains to be) sampled or not.
    data_.set_tree(CordRep::Ref(src_tree));
    CordzInfo::MaybeTrackCord(data_, src.data_, method);
  } else {
    CordzInfo::MaybeUntrackCord(data_.cordz_info());
    data_ = src.data_;
  }
  CordRep::Unref(tree);
}